

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbis.c
# Opt level: O2

void vorbis_stream_destroy(vorbis_stream_t *vorbis)

{
  long lVar1;
  
  ogg_page_destroy(&vorbis->page);
  vorbis->segment = '\0';
  for (lVar1 = 8; lVar1 != 0xcd8; lVar1 = lVar1 + 0x148) {
    ogg_page_destroy((ogg_page_t *)(vorbis->hdr_pages[0].position + lVar1 + -0xc));
  }
  buf_free(&vorbis->id_hdr);
  buf_free(&vorbis->comment_hdr);
  buf_free(&vorbis->setup_hdr);
  return;
}

Assistant:

void vorbis_stream_destroy(vorbis_stream_t *vorbis) {
  ogg_page_destroy(&vorbis->page);
  vorbis->segment = 0;

  int i;
  for (i = 0; i < VORBIS_MAX_HDR_PAGES; i++)
    ogg_page_destroy(vorbis->hdr_pages + i);

  buf_free(&vorbis->id_hdr);
  buf_free(&vorbis->comment_hdr);
  buf_free(&vorbis->setup_hdr);  
}